

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O0

void __thiscall Palette::writeSettings(Palette *this,QSettings *settings)

{
  QSettings *pQVar1;
  QVariant *pQVar2;
  QVariant local_78;
  undefined1 local_58 [8];
  QString color;
  int i;
  QString local_30;
  QSettings *local_18;
  QSettings *settings_local;
  Palette *this_local;
  
  local_18 = settings;
  settings_local = (QSettings *)this;
  QSettings::beginGroup((QString *)settings);
  pQVar1 = local_18;
  QString::QString(&local_30);
  QSettings::remove((QString *)pQVar1);
  QString::~QString(&local_30);
  for (color.d.size._0_4_ = 0; (int)color.d.size < 0x1a; color.d.size._0_4_ = (int)color.d.size + 1)
  {
    std::array<QColor,_26UL>::operator[](&this->mData,(long)(int)color.d.size);
    QColor::name((NameFormat)local_58);
    pQVar1 = local_18;
    pQVar2 = (QVariant *)
             std::array<QString,_26UL>::operator[]
                       ((array<QString,_26UL> *)PaletteTU::ColorKeys,(long)(int)color.d.size);
    QVariant::QVariant(&local_78,(QString *)local_58);
    QSettings::setValue((QString *)pQVar1,pQVar2);
    QVariant::~QVariant(&local_78);
    QString::~QString((QString *)local_58);
  }
  QSettings::endGroup();
  return;
}

Assistant:

void Palette::writeSettings(QSettings &settings) const {

    settings.beginGroup(Keys::Palette);
    settings.remove(QString()); // remove everything

    for (int i = 0; i < ColorCount; ++i) {
        QString color = mData[i].name();
        settings.setValue(TU::ColorKeys[i], color);
    }

    settings.endGroup();

}